

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidi.cpp
# Opt level: O2

int anon_unknown.dwarf_7357::RtMidi_compiledapis(lua_State *L)

{
  ulong uVar1;
  _Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_> local_38;
  
  local_38._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RtMidi::getCompiledApi((vector<RtMidi::Api,_std::allocator<RtMidi::Api>_> *)&local_38);
  lua_createtable(L,(ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_38._M_impl.super__Vector_impl_data._M_start) >> 2,0);
  uVar1 = 0;
  while( true ) {
    if ((ulong)((long)local_38._M_impl.super__Vector_impl_data._M_finish -
                (long)local_38._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar1) break;
    lua_pushinteger(L,local_38._M_impl.super__Vector_impl_data._M_start[uVar1]);
    uVar1 = uVar1 + 1;
    lua_rawseti(L,0xfffffffe,uVar1 & 0xffffffff);
  }
  std::_Vector_base<RtMidi::Api,_std::allocator<RtMidi::Api>_>::~_Vector_base(&local_38);
  return 1;
}

Assistant:

int RtMidi_compiledapis(lua_State *L) {
	auto apis = std::vector<RtMidi::Api> { };
	RtMidi::getCompiledApi(apis);
	lua_createtable(L, apis.size(), 0);
	for (std::size_t i = 0; i < apis.size(); ++i) {
		lua_pushinteger(L, apis[i]);
		lua_rawseti(L, -2, i + 1);
	}
	return 1;
}